

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
::BuiltinPrecisionCaseTestInstance
          (BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
           *this,Context *context,CaseContext *caseCtx,ShaderSpec *shaderSpec,
          Variables<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
          *variables,
          Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *samplings,StatementP *stmt)

{
  deInt32 *pdVar1;
  pointer pcVar2;
  SharedPtrStateBase *pSVar3;
  ShaderExecutor *pSVar4;
  long lVar5;
  TestContext **ppTVar6;
  TestContext **ppTVar7;
  byte bVar8;
  
  bVar8 = 0;
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BuiltinPrecisionCaseTestInstance_00d3bdc0;
  (this->m_caseCtx).name._M_dataplus._M_p = (pointer)&(this->m_caseCtx).name.field_2;
  pcVar2 = (caseCtx->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_caseCtx,pcVar2,pcVar2 + (caseCtx->name)._M_string_length);
  ppTVar6 = &caseCtx->testContext;
  ppTVar7 = &(this->m_caseCtx).testContext;
  for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
    *ppTVar7 = *ppTVar6;
    ppTVar6 = ppTVar6 + (ulong)bVar8 * -2 + 1;
    ppTVar7 = ppTVar7 + (ulong)bVar8 * -2 + 1;
  }
  (this->m_variables).in0.
  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_ptr =
       (variables->in0).
       super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_ptr;
  pSVar3 = (variables->in0).
           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_state;
  (this->m_variables).in0.
  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_state = pSVar3;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_variables).in0.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.
              m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  (this->m_variables).in1.
  super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr =
       (variables->in1).
       super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr;
  pSVar3 = (variables->in1).
           super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state;
  (this->m_variables).in1.
  super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state = pSVar3;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_variables).in1.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
              m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  (this->m_variables).in2.
  super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr =
       (variables->in2).
       super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr;
  pSVar3 = (variables->in2).
           super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state;
  (this->m_variables).in2.
  super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state = pSVar3;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_variables).in2.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
              m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  (this->m_variables).in3.
  super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr =
       (variables->in3).
       super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr;
  pSVar3 = (variables->in3).
           super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state;
  (this->m_variables).in3.
  super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state = pSVar3;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_variables).in3.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
              m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  (this->m_variables).out0.
  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_ptr =
       (variables->out0).
       super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_ptr;
  pSVar3 = (variables->out0).
           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_state;
  (this->m_variables).out0.
  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_state = pSVar3;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_variables).out0.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.
              m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  (this->m_variables).out1.
  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_ptr =
       (variables->out1).
       super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_ptr;
  pSVar3 = (variables->out1).
           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_state;
  (this->m_variables).out1.
  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_state = pSVar3;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_variables).out1.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.
              m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  this->m_samplings = samplings;
  (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr =
       (stmt->super_SharedPtr<const_vkt::shaderexecutor::Statement>).m_ptr;
  pSVar3 = (stmt->super_SharedPtr<const_vkt::shaderexecutor::Statement>).m_state;
  (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state = pSVar3;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  pSVar4 = createExecutor(context,caseCtx->shaderType,shaderSpec,(VkDescriptorSetLayout)0x0);
  (this->m_executor).
  super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  .m_data.ptr = pSVar4;
  return;
}

Assistant:

BuiltinPrecisionCaseTestInstance	(Context&						context,
																		 const CaseContext				caseCtx,
																		 const ShaderSpec&				shaderSpec,
																		 const Variables<In, Out>		variables,
																		 const Samplings<In>&			samplings,
																		 const StatementP				stmt)
										: TestInstance	(context)
										, m_caseCtx		(caseCtx)
										, m_variables	(variables)
										, m_samplings	(samplings)
										, m_stmt		(stmt)
										, m_executor	(createExecutor(context, caseCtx.shaderType, shaderSpec))
									{
									}